

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O2

void __thiscall
TLaplaceExampleTimeDependent::uxy<Fad<Fad<double>>>
          (TLaplaceExampleTimeDependent *this,TPZVec<Fad<Fad<double>_>_> *x,
          TPZVec<Fad<Fad<double>_>_> *disp)

{
  int iVar1;
  FADFADSTATE *this_00;
  FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> local_398;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
  local_388;
  FADFADSTATE local_378;
  FADFADSTATE local_320;
  FADFADSTATE local_2c8;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> local_270;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> local_250;
  FADFADSTATE local_230;
  FADFADSTATE local_1d8;
  FADFADSTATE local_180;
  FADFADSTATE local_128;
  FADFADSTATE local_d0;
  FADFADSTATE local_78;
  
  iVar1 = *(int *)&(this->super_TPZAnalyticSolution).field_0xc;
  if (iVar1 == 3) {
    local_250.fadexpr_.right_ = x->fStore;
    local_250.fadexpr_.left_.constant_ = 1.5707963267948966;
    local_250.fadexpr_.left_.defaultVal = 0.0;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_1d8,&local_250);
    FADcos(&local_2c8,&local_1d8);
    local_270.fadexpr_.right_ = x->fStore + 1;
    local_270.fadexpr_.left_.constant_ = 1.5707963267948966;
    local_270.fadexpr_.left_.defaultVal = 0.0;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_230,&local_270);
    FADcos(&local_320,&local_230);
    local_d0.val_.val_ = this->fTime * -4.934802200544679;
    local_d0.val_.dx_.num_elts = 0;
    local_d0.defaultVal.dx_.ptr_to_data = (double *)0x0;
    local_d0.defaultVal.defaultVal = 0.0;
    local_d0.val_.dx_.ptr_to_data = (double *)0x0;
    local_d0.val_.defaultVal = 0.0;
    local_d0.dx_.num_elts = 0;
    local_d0.dx_.ptr_to_data = (Fad<double> *)0x0;
    local_d0.defaultVal.val_ = 0.0;
    local_d0.defaultVal.dx_.num_elts = 0;
    local_398.fadexpr_.left_ = &local_2c8;
    local_398.fadexpr_.right_ = &local_320;
    FADexp(&local_378,&local_d0);
    local_388.fadexpr_.left_ = &local_398;
    local_388.fadexpr_.right_ = &local_378;
    Fad<Fad<double>>::operator=((Fad<Fad<double>> *)disp->fStore,&local_388);
    Fad<Fad<double>_>::~Fad(&local_378);
    Fad<Fad<double>_>::~Fad(&local_d0);
    Fad<Fad<double>_>::~Fad(&local_320);
    Fad<Fad<double>_>::~Fad(&local_230);
    Fad<Fad<double>_>::~Fad(&local_2c8);
    this_00 = &local_1d8;
  }
  else {
    if (iVar1 != 2) {
      if (iVar1 == 1) {
        Fad<Fad<double>_>::operator=(disp->fStore,x->fStore);
        return;
      }
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZAnalyticSolution.cpp"
                 ,0x814);
    }
    local_250.fadexpr_.right_ = x->fStore;
    local_250.fadexpr_.left_.constant_ = 3.141592653589793;
    local_250.fadexpr_.left_.defaultVal = 0.0;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_128,&local_250);
    FADsin(&local_2c8,&local_128);
    local_270.fadexpr_.right_ = x->fStore + 1;
    local_270.fadexpr_.left_.constant_ = 3.141592653589793;
    local_270.fadexpr_.left_.defaultVal = 0.0;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_180,&local_270);
    FADsin(&local_320,&local_180);
    local_78.val_.val_ = this->fTime * -19.739208802178716;
    local_78.val_.dx_.num_elts = 0;
    local_78.defaultVal.dx_.ptr_to_data = (double *)0x0;
    local_78.defaultVal.defaultVal = 0.0;
    local_78.val_.dx_.ptr_to_data = (double *)0x0;
    local_78.val_.defaultVal = 0.0;
    local_78.dx_.num_elts = 0;
    local_78.dx_.ptr_to_data = (Fad<double> *)0x0;
    local_78.defaultVal.val_ = 0.0;
    local_78.defaultVal.dx_.num_elts = 0;
    local_398.fadexpr_.left_ = &local_2c8;
    local_398.fadexpr_.right_ = &local_320;
    FADexp(&local_378,&local_78);
    local_388.fadexpr_.left_ = &local_398;
    local_388.fadexpr_.right_ = &local_378;
    Fad<Fad<double>>::operator=((Fad<Fad<double>> *)disp->fStore,&local_388);
    Fad<Fad<double>_>::~Fad(&local_378);
    Fad<Fad<double>_>::~Fad(&local_78);
    Fad<Fad<double>_>::~Fad(&local_320);
    Fad<Fad<double>_>::~Fad(&local_180);
    Fad<Fad<double>_>::~Fad(&local_2c8);
    this_00 = &local_128;
  }
  Fad<Fad<double>_>::~Fad(this_00);
  return;
}

Assistant:

void TLaplaceExampleTimeDependent::uxy(const TPZVec<FADFADSTATE > &x, TPZVec<FADFADSTATE > &disp) const
{
    switch(fProblemType)
    {
        case ELinear:
            disp[0] = x[0];
            break;
        case ESin:
            disp[0] = FADsin(M_PI*x[0])*FADsin(M_PI*x[1])*FADexp(-2.*M_PI*M_PI*fTime);
            break;
        case ECos:
            disp[0] = FADcos(M_PI_2*x[0])*FADcos(M_PI_2*x[1])*FADexp(-M_PI*M_PI_2*fTime);
            break;
        default:
            DebugStop();
    }

}